

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

OwnFd * __thiscall
kj::_::NullableValue<kj::OwnFd>::emplace<kj::OwnFd>(NullableValue<kj::OwnFd> *this,OwnFd *params)

{
  OwnFd *params_00;
  OwnFd *params_local;
  NullableValue<kj::OwnFd> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<kj::OwnFd>(&(this->field_1).value);
  }
  params_00 = fwd<kj::OwnFd>(params);
  ctor<kj::OwnFd,kj::OwnFd>(&(this->field_1).value,params_00);
  this->isSet = true;
  return (OwnFd *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }